

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literals * wasm::Literal::makeZeros(Literals *__return_storage_ptr__,Type type)

{
  Type *pTVar1;
  Type *pTVar2;
  Literal local_50;
  Type local_38;
  Type type_local;
  Iterator __begin1;
  
  local_38.id = type.id;
  if (type.id < 2) {
    __assert_fail("type.isConcrete()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                  ,0xe5,"static Literals wasm::Literal::makeZeros(Type)");
  }
  (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.func.
  super_IString.str._M_str = (char *)0x0;
  (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id = 0;
  (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).usedFixed = 0;
  (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.i64 = 0;
  (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  type_local.id = (uintptr_t)&local_38;
  pTVar1 = (Type *)wasm::Type::size(&local_38);
  if (pTVar1 == (Type *)0x0) goto LAB_00c4140f;
  do {
    do {
      pTVar2 = wasm::Type::Iterator::operator*((Iterator *)&type_local);
      makeZero(&local_50,(Type)pTVar2->id);
      SmallVector<wasm::Literal,_1UL>::push_back
                (&__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>,&local_50);
      ~Literal(&local_50);
      __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)((long)&(__begin1.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                           parent)->id + 1);
    } while (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
             pTVar1);
LAB_00c4140f:
  } while ((Type *)type_local.id != &local_38);
  return __return_storage_ptr__;
}

Assistant:

Literals Literal::makeZeros(Type type) {
  assert(type.isConcrete());
  Literals zeroes;
  for (const auto& t : type) {
    zeroes.push_back(makeZero(t));
  }
  return zeroes;
}